

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code.cpp
# Opt level: O2

bool __thiscall Code::checkExtremalVertex(Code *this,int vertexIndex,string *direction)

{
  pointer pvVar1;
  int *piVar2;
  bool bVar3;
  undefined8 in_RAX;
  mapped_type *pmVar4;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var5;
  int *piVar6;
  pointer pvVar7;
  int edgeIndex;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
           ::operator[](&this->upEdgesMap,direction);
  pvVar7 = (pmVar4->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start + vertexIndex;
  pvVar1 = (this->vertexToEdges).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  piVar6 = pvVar1[vertexIndex].super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar2 = *(pointer *)
            ((long)&pvVar1[vertexIndex].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data + 8);
  bVar3 = false;
  do {
    if (piVar6 == piVar2) {
      return bVar3;
    }
    uStack_38 = CONCAT44(*piVar6,(undefined4)uStack_38);
    if ((this->syndrome).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_start[*piVar6] == '\x01') {
      _Var5 = std::
              __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                        ((pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start,
                         *(pointer *)
                          ((long)&(pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                  super__Vector_impl_data + 8),(long)&uStack_38 + 4);
      bVar3 = true;
      if (_Var5._M_current ==
          *(pointer *)
           ((long)&(pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data + 8)) {
        return false;
      }
    }
    piVar6 = piVar6 + 1;
  } while( true );
}

Assistant:

bool Code::checkExtremalVertex(const int vertexIndex, const std::string &direction)
{
    auto &upEdges = upEdgesMap[direction][vertexIndex];
    auto &edges = vertexToEdges[vertexIndex];
    bool edgeInSyndrome = false;
    for (const int edgeIndex : edges)
    {
        if (syndrome[edgeIndex] == 1)
        {
            edgeInSyndrome = true;
            if (std::find(upEdges.begin(), upEdges.end(), edgeIndex) == upEdges.end())
            {
                // Edge in syndrome is not an up-edge => vertex is not extremal
                return false;
            }
        }
    }
    return edgeInSyndrome;
}